

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_name.c
# Opt level: O0

int ks_getuntil2(kstream_t *ks,int delimiter,kstring_t *str,int *dret,int append)

{
  bool bVar1;
  int iVar2;
  ushort **ppuVar3;
  char *pcVar4;
  size_t local_48;
  int local_3c;
  int i;
  int gotany;
  int append_local;
  int *dret_local;
  kstring_t *str_local;
  int delimiter_local;
  kstream_t *ks_local;
  
  bVar1 = false;
  if (dret != (int *)0x0) {
    *dret = 0;
  }
  if (append == 0) {
    local_48 = 0;
  }
  else {
    local_48 = str->l;
  }
  str->l = local_48;
  do {
    if (ks->end <= ks->begin) {
      if (ks->is_eof != 0) goto LAB_0010762a;
      ks->begin = 0;
      iVar2 = gzread(ks->f,ks->buf,0xffff);
      ks->end = iVar2;
      if (ks->end == 0) {
        ks->is_eof = 1;
        goto LAB_0010762a;
      }
    }
    if (delimiter == 2) {
      for (local_3c = ks->begin; (local_3c < ks->end && (ks->buf[local_3c] != '\n'));
          local_3c = local_3c + 1) {
      }
    }
    else if (delimiter < 3) {
      if (delimiter == 0) {
        local_3c = ks->begin;
        while ((local_3c < ks->end &&
               (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)(uint)ks->buf[local_3c]] & 0x2000) == 0)
               )) {
          local_3c = local_3c + 1;
        }
      }
      else if (delimiter == 1) {
        for (local_3c = ks->begin;
            (local_3c < ks->end &&
            ((ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)(uint)ks->buf[local_3c]] & 0x2000) == 0 ||
             (ks->buf[local_3c] == ' ')))); local_3c = local_3c + 1) {
        }
      }
      else {
        local_3c = 0;
      }
    }
    else {
      local_3c = ks->begin;
      while ((local_3c < ks->end && ((uint)ks->buf[local_3c] != delimiter))) {
        local_3c = local_3c + 1;
      }
    }
    if (str->m - str->l < (ulong)(long)((local_3c - ks->begin) + 1)) {
      str->m = str->l + (long)(local_3c - ks->begin) + 1;
      str->m = str->m - 1;
      str->m = str->m >> 1 | str->m;
      str->m = str->m >> 2 | str->m;
      str->m = str->m >> 4 | str->m;
      str->m = str->m >> 8 | str->m;
      str->m = str->m >> 0x10 | str->m;
      str->m = str->m + 1;
      pcVar4 = (char *)realloc(str->s,str->m);
      str->s = pcVar4;
    }
    bVar1 = true;
    memcpy(str->s + str->l,ks->buf + ks->begin,(long)(local_3c - ks->begin));
    str->l = str->l + (long)(local_3c - ks->begin);
    ks->begin = local_3c + 1;
    if (local_3c < ks->end) {
      if (dret != (int *)0x0) {
        *dret = (uint)ks->buf[local_3c];
      }
LAB_0010762a:
      if (((bVar1) || (ks->is_eof == 0)) || (ks->begin < ks->end)) {
        if (str->s == (char *)0x0) {
          str->m = 1;
          pcVar4 = (char *)calloc(1,1);
          str->s = pcVar4;
        }
        else if (((delimiter == 2) && (1 < str->l)) && (str->s[str->l - 1] == '\r')) {
          str->l = str->l - 1;
        }
        str->s[str->l] = '\0';
        ks_local._4_4_ = (int)str->l;
      }
      else {
        ks_local._4_4_ = -1;
      }
      return ks_local._4_4_;
    }
  } while( true );
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_name(char *input_file, FILE *names_fp, int min, int max, int length, int exclude, int convert, int just_count) {
	gzFile fp;
	int i,l,capacity=80;
	int count=0,excluded=0;
	int is_fasta = -1;
	char *fasta_name;
	char *line;
	kseq_t *seq;

	/* get some space for the line */
	line = malloc(sizeof(char) * capacity); /* get memory allocated */
	if (!line) {
		fprintf(stderr, "%s - line malloc: %s\n",progname, strerror(errno));
		exit(EXIT_FAILURE);
	}

	while((i = getl(&line, names_fp)) != -1) {
		fasta_name = parse_name(line);
		if (fasta_name) {
			add_name(fasta_name);             /* add fasta_name to hash */
		}
	}

	free(line); /* free up line */

	if (verbose_flag) {
		fprintf(stderr,"\n");
		fprintf(stderr,"done reading from input (%d entries)\n", hash_key_count());
	}
	/*print_hash();*/


	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp); /* initialize kseq */

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); /* rewind to beginning for main loop */
	kseq_rewind(seq);

	if (verbose_flag) {
		if (is_fasta)
			fprintf(stderr, "Input is FASTA format\n");
		else
			fprintf(stderr, "Input is FASTQ format\n");
	}

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		if (exclude == 0) { /* INCLUDE names from names file */
			if (find_name(seq->name.s))            /* found name in list */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			else
				excluded++;
		} else { /* EXCLUDE names from names file */
			if (find_name(seq->name.s))            /* found name in list */
				excluded++;
			else
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
		}
	}
	kseq_destroy(seq);
	gzclose(fp); /* done reading file */

	delete_hash(); /* free the list nodes */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		if (exclude)
			fprintf(stdout, "Total excluded: %i\n", excluded);
	}

	if (verbose_flag) {
		fprintf(stderr,"Processed %i entries\n",count);
		if (exclude)
			fprintf(stderr,"Excluded %i entries\n",excluded);
	}
	return count;
}